

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O1

void __thiscall
GlobOptBlockData::KillStateForGeneratorYield(GlobOptBlockData *this,Instr *yieldInstr)

{
  BVSparse<Memory::JitArenaAllocator> *pBVar1;
  Type pJVar2;
  Type pBVar3;
  Type_conflict pBVar4;
  Type_conflict pBVar5;
  
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
            (this->liveInt32Syms,this->liveVarSyms);
  GlobOpt::ToVar(this->globOpt,this->liveInt32Syms,this->globOpt->currentBlock,yieldInstr);
  pBVar1 = this->liveInt32Syms;
  if (pBVar1->head != (Type_conflict)0x0) {
    pJVar2 = pBVar1->alloc;
    pBVar3 = pBVar1->head;
    pBVar5 = pJVar2->bvFreeList;
    do {
      pBVar4 = pBVar3;
      pBVar3 = pBVar4->next;
      pBVar4->next = pBVar5;
      pBVar5 = pBVar4;
    } while (pBVar3 != (Type)0x0);
    pJVar2->bvFreeList = pBVar4;
  }
  pBVar1->head = (Type_conflict)0x0;
  pBVar1->lastFoundIndex = (Type_conflict)0x0;
  pBVar1->lastUsedNodePrevNextField = &pBVar1->head;
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
            (this->liveFloat64Syms,this->liveVarSyms);
  GlobOpt::ToVar(this->globOpt,this->liveFloat64Syms,this->globOpt->currentBlock,yieldInstr);
  pBVar1 = this->liveFloat64Syms;
  if (pBVar1->head != (Type_conflict)0x0) {
    pJVar2 = pBVar1->alloc;
    pBVar3 = pBVar1->head;
    pBVar5 = pJVar2->bvFreeList;
    do {
      pBVar4 = pBVar3;
      pBVar3 = pBVar4->next;
      pBVar4->next = pBVar5;
      pBVar5 = pBVar4;
    } while (pBVar3 != (Type)0x0);
    pJVar2->bvFreeList = pBVar4;
  }
  pBVar1->head = (Type_conflict)0x0;
  pBVar1->lastFoundIndex = (Type_conflict)0x0;
  pBVar1->lastUsedNodePrevNextField = &pBVar1->head;
  pBVar1 = this->liveLossyInt32Syms;
  if (pBVar1->head != (Type_conflict)0x0) {
    pJVar2 = pBVar1->alloc;
    pBVar3 = pBVar1->head;
    pBVar5 = pJVar2->bvFreeList;
    do {
      pBVar4 = pBVar3;
      pBVar3 = pBVar4->next;
      pBVar4->next = pBVar5;
      pBVar5 = pBVar4;
    } while (pBVar3 != (Type)0x0);
    pJVar2->bvFreeList = pBVar4;
  }
  pBVar1->head = (Type_conflict)0x0;
  pBVar1->lastFoundIndex = (Type_conflict)0x0;
  pBVar1->lastUsedNodePrevNextField = &pBVar1->head;
  this->hasCSECandidates = false;
  ValueHashTable<ExprHash,_Value_*>::ClearAll(this->exprToValueMap);
  KillSymToValueMapForGeneratorYield(this);
  return;
}

Assistant:

void
GlobOptBlockData::KillStateForGeneratorYield(IR::Instr* yieldInstr)
{
    this->liveInt32Syms->Minus(this->liveVarSyms);
    this->globOpt->ToVar(liveInt32Syms, this->globOpt->currentBlock, yieldInstr /* insertBeforeInstr */);
    this->liveInt32Syms->ClearAll();

    this->liveFloat64Syms->Minus(this->liveVarSyms);
    this->globOpt->ToVar(liveFloat64Syms, this->globOpt->currentBlock, yieldInstr /* insertBeforeInstr */);
    this->liveFloat64Syms->ClearAll();

    this->liveLossyInt32Syms->ClearAll();
    // Keep this->liveVarSyms as is
    // Keep this->argObjSyms as is

    this->hasCSECandidates = false;

    // No need to clear `isTempSrc` (used for in-place string concat)

    this->exprToValueMap->ClearAll();

    this->KillSymToValueMapForGeneratorYield();
}